

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.cpp
# Opt level: O0

void __thiscall
cfd::api::json::ElementsDecodeIssuance::ConvertFromStruct
          (ElementsDecodeIssuance *this,ElementsDecodeIssuanceStruct *data)

{
  string *in_RSI;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  
  std::__cxx11::string::operator=((string *)&in_RDI[1]._M_t._M_impl.super__Rb_tree_header,in_RSI);
  std::__cxx11::string::operator=
            ((string *)&in_RDI[1]._M_t._M_impl.super__Rb_tree_header._M_node_count,in_RSI + 0x20);
  std::__cxx11::string::operator=
            ((string *)&in_RDI[2]._M_t._M_impl.super__Rb_tree_header._M_header._M_left,in_RSI + 0x40
            );
  *(undefined1 *)&in_RDI[3]._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       (byte)in_RSI[0x60] & _S_black;
  std::__cxx11::string::operator=
            ((string *)&in_RDI[3]._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
             in_RSI + 0x68);
  std::__cxx11::string::operator=((string *)(in_RDI + 4),in_RSI + 0x88);
  in_RDI[4]._M_t._M_impl.super__Rb_tree_header._M_header._M_right = *(_Base_ptr *)(in_RSI + 0xa8);
  std::__cxx11::string::operator=
            ((string *)&in_RDI[4]._M_t._M_impl.super__Rb_tree_header._M_node_count,in_RSI + 0xb0);
  in_RDI[5]._M_t._M_impl.super__Rb_tree_header._M_header._M_left = *(_Base_ptr *)(in_RSI + 0xd0);
  std::__cxx11::string::operator=
            ((string *)&in_RDI[5]._M_t._M_impl.super__Rb_tree_header._M_header._M_right,
             in_RSI + 0xd8);
  std::__cxx11::string::operator=
            ((string *)&in_RDI[6]._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
             in_RSI + 0xf8);
  std::__cxx11::string::operator=((string *)(in_RDI + 7),in_RSI + 0x118);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_RSI,in_RDI);
  return;
}

Assistant:

void ElementsDecodeIssuance::ConvertFromStruct(
    const ElementsDecodeIssuanceStruct& data) {
  asset_blinding_nonce_ = data.asset_blinding_nonce;
  asset_entropy_ = data.asset_entropy;
  contract_hash_ = data.contract_hash;
  isreissuance_ = data.isreissuance;
  token_ = data.token;
  asset_ = data.asset;
  assetamount_ = data.assetamount;
  assetamountcommitment_ = data.assetamountcommitment;
  tokenamount_ = data.tokenamount;
  tokenamountcommitment_ = data.tokenamountcommitment;
  asset_rangeproof_ = data.asset_rangeproof;
  token_rangeproof_ = data.token_rangeproof;
  ignore_items = data.ignore_items;
}